

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool QSslSocket::isClassImplemented(ImplementedClass cl,QString *backendName)

{
  byte bVar1;
  long in_FS_OFFSET;
  ImplementedClass *in_stack_ffffffffffffffb8;
  QListSpecialMethodsBase<QSsl::ImplementedClass> *this;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  QListSpecialMethodsBase<QSsl::ImplementedClass> local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_28;
  implementedClasses((QString *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = QListSpecialMethodsBase<QSsl::ImplementedClass>::contains<QSsl::ImplementedClass>
                    (this,in_stack_ffffffffffffffb8);
  QList<QSsl::ImplementedClass>::~QList((QList<QSsl::ImplementedClass> *)0x3a41c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::isClassImplemented(QSsl::ImplementedClass cl, const QString &backendName)
{
    return implementedClasses(backendName).contains(cl);
}